

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O0

void buffer_appendf(char **_buf,int *bufpos,void *fmt,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [24];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  int local_5c;
  char *pcStack_58;
  int slen;
  char *s;
  undefined4 local_48;
  int salloc;
  va_list ap;
  char *buf;
  void *fmt_local;
  int *bufpos_local;
  char **_buf_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  pcVar1 = *_buf;
  s._4_4_ = 0x80;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  pcStack_58 = (char *)malloc(0x80);
  ap[0].overflow_arg_area = local_118;
  ap[0]._0_8_ = &stack0x00000008;
  salloc = 0x30;
  local_48 = 0x18;
  local_5c = vsnprintf(pcStack_58,(long)s._4_4_,(char *)fmt,&local_48);
  if (s._4_4_ <= local_5c) {
    pcStack_58 = (char *)realloc(pcStack_58,(long)(local_5c + 1));
    ap[0].overflow_arg_area = local_118;
    ap[0]._0_8_ = &stack0x00000008;
    salloc = 0x30;
    local_48 = 0x18;
    vsprintf(pcStack_58,(char *)fmt,&local_48);
  }
  pcVar1 = (char *)realloc(pcVar1,(long)(*bufpos + 1 + local_5c));
  *_buf = pcVar1;
  memcpy(pcVar1 + *bufpos,pcStack_58,(long)(local_5c + 1));
  *bufpos = *bufpos + local_5c;
  free(pcStack_58);
  return;
}

Assistant:

static void buffer_appendf(char **_buf, int *bufpos, void *fmt, ...)
{
    char *buf = *_buf;
    va_list ap;

    int salloc = 128;
    char *s = malloc(salloc);

    va_start(ap, fmt);
    int slen = vsnprintf(s, salloc, fmt, ap);
    va_end(ap);

    if (slen >= salloc) {
        s = realloc(s, slen + 1);
        va_start(ap, fmt);
        vsprintf((char*) s, fmt, ap);
        va_end(ap);
    }

    buf = realloc(buf, *bufpos + slen + 1);
    *_buf = buf;

    memcpy(&buf[*bufpos], s, slen + 1); // get trailing \0
    (*bufpos) += slen;

    free(s);
}